

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell::createTest
          (TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x1c5);
  TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_Test::
  TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_Test
            ((TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, LongIntegerReturnValueSetsDifferentValues)
{
    long int expected_value = 1;
    long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getLongIntValue());
    LONGS_EQUAL(expected_value, mock().returnValue().getLongIntValue());
    LONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getLongIntValue());
    LONGS_EQUAL(another_expected_value, mock().returnValue().getLongIntValue());
}